

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programEntity.c
# Opt level: O1

void sysbvm_programEntity_recordBindingWithOwnerAndName
               (sysbvm_context_t *context,sysbvm_tuple_t programEntity,sysbvm_tuple_t owner,
               sysbvm_tuple_t name)

{
  _Bool _Var1;
  
  _Var1 = sysbvm_tuple_isKindOf(context,programEntity,(context->roots).programEntityType);
  if ((((owner != programEntity) && (_Var1)) && (*(long *)(programEntity + 0x18) == 0)) &&
     (*(long *)(programEntity + 0x10) == 0)) {
    *(sysbvm_tuple_t *)(programEntity + 0x18) = owner;
    *(sysbvm_tuple_t *)(programEntity + 0x10) = name;
    sysbvm_programEntity_recordChild(context,owner,programEntity);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_programEntity_recordBindingWithOwnerAndName(sysbvm_context_t *context, sysbvm_tuple_t programEntity, sysbvm_tuple_t owner, sysbvm_tuple_t name)
{
    if(!sysbvm_tuple_isKindOf(context, programEntity, context->roots.programEntityType)) return;
    if(owner == programEntity) return;

    sysbvm_programEntity_t *programEntityObject = (sysbvm_programEntity_t*)programEntity;
    if(!programEntityObject->owner && !programEntityObject->name)
    {
        programEntityObject->owner = owner;
        programEntityObject->name = name;

        sysbvm_programEntity_recordChild(context, owner, programEntity);
    }
}